

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_411427::InlineImageTracker::~InlineImageTracker(InlineImageTracker *this)

{
  InlineImageTracker *this_local;
  
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_0058fe00;
  std::__cxx11::string::~string((string *)&this->bi_str);
  std::__cxx11::string::~string((string *)&this->dict_str);
  QPDFObjectHandle::~QPDFObjectHandle(&this->resources);
  QPDFObjectHandle::TokenFilter::~TokenFilter(&this->super_TokenFilter);
  return;
}

Assistant:

~InlineImageTracker() override = default;